

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O3

HighsDebugStatus __thiscall
HEkk::debugOkForSolve(HEkk *this,SimplexAlgorithm algorithm,HighsInt phase)

{
  int iVar1;
  HighsOptions *pHVar2;
  byte bVar3;
  bool bVar4;
  HighsDebugStatus HVar5;
  uint uVar6;
  ulong uVar7;
  
  pHVar2 = this->options_;
  if ((pHVar2->super_HighsOptionsStruct).highs_debug_level < 1) {
    return kNotChecked;
  }
  if ((this->status_).has_basis == true) {
    bVar3 = (this->status_).has_ar_matrix;
    if ((((bool)bVar3 == true) && ((this->status_).has_nla == true)) &&
       ((this->status_).has_invert != false)) goto LAB_00347a67;
  }
  else {
    highsLogDev(&(pHVar2->super_HighsOptionsStruct).log_options,kError,
                "Not OK to solve since status.has_basis = %d\n",0);
    bVar3 = (this->status_).has_ar_matrix;
  }
  if ((bVar3 & 1) == 0) {
    highsLogDev(&(pHVar2->super_HighsOptionsStruct).log_options,kError,
                "Not OK to solve since status.has_ar_matrix = %d\n",0);
  }
  if ((this->status_).has_nla == false) {
    highsLogDev(&(pHVar2->super_HighsOptionsStruct).log_options,kError,
                "Not OK to solve since status.has_nla = %d\n",0);
  }
  if ((this->status_).has_dual_steepest_edge_weights == false) {
    highsLogDev(&(pHVar2->super_HighsOptionsStruct).log_options,kError,
                "Not OK to solve since status.has_dual_steepest_edge_weights = %d\n",0);
  }
  if ((this->status_).has_invert == false) {
    highsLogDev(&(pHVar2->super_HighsOptionsStruct).log_options,kError,
                "Not OK to solve since status.has_invert = %d\n",0);
  }
LAB_00347a67:
  HVar5 = kOk;
  if (1 < (this->options_->super_HighsOptionsStruct).highs_debug_level) {
    HVar5 = debugBasisConsistent(this);
    if ((HVar5 == kLogicalError) || (bVar4 = debugWorkArraysOk(this,algorithm,phase), !bVar4)) {
LAB_00347ad3:
      HVar5 = kLogicalError;
    }
    else {
      iVar1 = (this->lp_).num_row_;
      uVar6 = iVar1 + (this->lp_).num_col_;
      HVar5 = kOk;
      if (uVar6 != 0 && SCARRY4(iVar1,(this->lp_).num_col_) == (int)uVar6 < 0) {
        uVar7 = 0;
        HVar5 = kOk;
        do {
          if (((this->basis_).nonbasicFlag_.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7] != '\0') &&
             (bVar4 = debugOneNonbasicMoveVsWorkArraysOk(this,(HighsInt)uVar7), !bVar4))
          goto LAB_00347ad3;
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
    }
  }
  return HVar5;
}

Assistant:

HighsDebugStatus HEkk::debugOkForSolve(const SimplexAlgorithm algorithm,
                                       const HighsInt phase) const {
  if (this->options_->highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  const HighsDebugStatus return_status = HighsDebugStatus::kOk;
  const HighsLp& lp = this->lp_;
  const HighsSimplexStatus& status = this->status_;
  const SimplexBasis& basis = this->basis_;
  const HighsOptions& options = *this->options_;
  bool ok;
  // Minimal check - just look at flags. This means we trust them!
  ok = status.has_basis && status.has_ar_matrix && status.has_nla &&
       //       status.has_dual_steepest_edge_weights &&
       status.has_invert;
  if (!ok) {
    if (!status.has_basis)
      highsLogDev(options.log_options, HighsLogType::kError,
                  "Not OK to solve since status.has_basis = "
                  "%" HIGHSINT_FORMAT "\n",
                  status.has_basis);
    if (!status.has_ar_matrix)
      highsLogDev(options.log_options, HighsLogType::kError,
                  "Not OK to solve since status.has_ar_matrix = "
                  "%" HIGHSINT_FORMAT "\n",
                  status.has_ar_matrix);
    if (!status.has_nla)
      highsLogDev(options.log_options, HighsLogType::kError,
                  "Not OK to solve since status.has_nla "
                  "= %" HIGHSINT_FORMAT "\n",
                  status.has_nla);
    if (!status.has_dual_steepest_edge_weights)
      highsLogDev(options.log_options, HighsLogType::kError,
                  "Not OK to solve since "
                  "status.has_dual_steepest_edge_weights = %" HIGHSINT_FORMAT
                  "\n",
                  status.has_dual_steepest_edge_weights);
    if (!status.has_invert)
      highsLogDev(options.log_options, HighsLogType::kError,
                  "Not OK to solve since status.has_invert = "
                  "%" HIGHSINT_FORMAT "\n",
                  status.has_invert);
  }
  if (this->options_->highs_debug_level < kHighsDebugLevelCostly)
    return return_status;
  // Basis and data check
  if (this->debugBasisConsistent() == HighsDebugStatus::kLogicalError)
    return HighsDebugStatus::kLogicalError;
  // Check work cost, lower, upper and range
  if (!this->debugWorkArraysOk(algorithm, phase))
    return HighsDebugStatus::kLogicalError;
  const HighsInt numTot = lp.num_col_ + lp.num_row_;
  // Check nonbasic move against work cost, lower, upper and range
  for (HighsInt var = 0; var < numTot; ++var) {
    if (basis.nonbasicFlag_[var]) {
      // Nonbasic variable
      if (!this->debugOneNonbasicMoveVsWorkArraysOk(var))
        return HighsDebugStatus::kLogicalError;
    }
  }
  return return_status;
}